

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::list_reader_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_list *tlist)

{
  int *piVar1;
  ostream *poVar2;
  string val;
  string desc;
  ostringstream out;
  string sStack_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  ostream local_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  temp_name_abi_cxx11_(&local_1b8,this);
  temp_name_abi_cxx11_(&local_1d8,this);
  poVar2 = std::operator<<(&local_198,"[|");
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"| ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2," := iprot readListBegin.");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
  poVar2 = std::operator<<(&local_198,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2," := OrderedCollection new.");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_218,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_218);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2," size timesRepeat: [");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
  poVar2 = std::operator<<(&local_198,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2," add: ");
  read_val_abi_cxx11_(&sStack_218,this,tlist->elem_type_);
  std::operator<<(poVar2,(string *)&sStack_218);
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = std::operator<<(&local_198,"].");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,"iprot readListEnd.");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_218,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_218);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  std::operator<<(poVar2,"] value");
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::list_reader(t_list* tlist) {
  std::ostringstream out;
  string desc = temp_name();
  string val = temp_name();

  out << "[|" << desc << " " << val << "| " << desc << " := iprot readListBegin." << endl;
  indent_up();

  out << indent() << val << " := OrderedCollection new." << endl << indent() << desc
      << " size timesRepeat: [" << endl;

  indent_up();
  out << indent() << val << " add: " << read_val(tlist->get_elem_type());
  indent_down();

  out << "]." << endl << indent() << "iprot readListEnd." << endl << indent() << val << "] value";
  indent_down();

  return out.str();
}